

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  XmlWriter *this_00;
  pointer pPVar1;
  char *this_01;
  pointer pPVar2;
  undefined1 local_b0 [8];
  string name;
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [16];
  
  trim((string *)local_b0,&(sectionNode->stats).sectionInfo.name);
  if (rootName->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff80,rootName,"/");
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::__cxx11::string::operator=((string *)local_b0,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    std::__cxx11::string::string
              ((string *)&local_60,"testcase",(allocator *)&stack0xffffffffffffff80);
    this_00 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)((long)&name.field_2 + 8),(string *)this_00);
    std::__cxx11::string::~string((string *)&local_60);
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&local_60,"classname",(allocator *)&stack0xffffffffffffff80);
      XmlWriter::writeAttribute(this_00,&local_60,(string *)local_b0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string((string *)&local_60,"name",(allocator *)&stack0xffffffffffffff80)
      ;
      XmlWriter::writeAttribute<char[5]>(this_00,&local_60,(char (*) [5])"root");
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_60,"classname",(allocator *)&stack0xffffffffffffff80);
      XmlWriter::writeAttribute(this_00,&local_60,className);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string((string *)&local_60,"name",(allocator *)&stack0xffffffffffffff80)
      ;
      XmlWriter::writeAttribute(this_00,&local_60,(string *)local_b0);
    }
    std::__cxx11::string::~string((string *)&local_60);
    this_01 = "time";
    std::__cxx11::string::string((string *)&local_60,"time",(allocator *)local_40);
    Catch::toString_abi_cxx11_
              ((string *)&stack0xffffffffffffff80,(Catch *)this_01,
               (sectionNode->stats).durationInSeconds);
    XmlWriter::writeAttribute(this_00,&local_60,(string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string((string *)&local_60);
    writeAssertions(this,sectionNode);
    if ((sectionNode->stdOut)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_60,"system-out",(allocator *)(local_40 + 0xf));
      XmlWriter::scopedElement((XmlWriter *)local_40,(string *)this_00);
      trim((string *)&stack0xffffffffffffff80,&sectionNode->stdOut);
      XmlWriter::writeText((XmlWriter *)local_40._0_8_,(string *)&stack0xffffffffffffff80,false);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_60,"system-err",(allocator *)(local_40 + 0xf));
      XmlWriter::scopedElement((XmlWriter *)local_40,(string *)this_00);
      trim((string *)&stack0xffffffffffffff80,&sectionNode->stdErr);
      XmlWriter::writeText((XmlWriter *)local_40._0_8_,(string *)&stack0xffffffffffffff80,false);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)((long)&name.field_2 + 8));
  }
  pPVar1 = (sectionNode->childSections).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (sectionNode->childSections).
                super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_60,"",(allocator *)&stack0xffffffffffffff80);
      writeSection(this,(string *)local_b0,&local_60,pPVar2->m_p);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      writeSection(this,className,(string *)local_b0,pPVar2->m_p);
    }
  }
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void writeSection(std::string const& className,
			std::string const& rootName,
			SectionNode const& sectionNode) {
			std::string name = trim(sectionNode.stats.sectionInfo.name);
			if (!rootName.empty())
				name = rootName + "/" + name;

			if (!sectionNode.assertions.empty() ||
				!sectionNode.stdOut.empty() ||
				!sectionNode.stdErr.empty()) {
				XmlWriter::ScopedElement e = xml.scopedElement("testcase");
				if (className.empty()) {
					xml.writeAttribute("classname", name);
					xml.writeAttribute("name", "root");
				}
				else {
					xml.writeAttribute("classname", className);
					xml.writeAttribute("name", name);
				}
				xml.writeAttribute("time", Catch::toString(sectionNode.stats.durationInSeconds));

				writeAssertions(sectionNode);

				if (!sectionNode.stdOut.empty())
					xml.scopedElement("system-out").writeText(trim(sectionNode.stdOut), false);
				if (!sectionNode.stdErr.empty())
					xml.scopedElement("system-err").writeText(trim(sectionNode.stdErr), false);
			}
			for (SectionNode::ChildSections::const_iterator
				it = sectionNode.childSections.begin(),
				itEnd = sectionNode.childSections.end();
				it != itEnd;
				++it)
				if (className.empty())
					writeSection(name, "", **it);
				else
					writeSection(className, name, **it);
		}